

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte *pbVar1;
  float fVar2;
  uint uVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  long lVar12;
  ImGuiTableInstanceData *pIVar13;
  bool bVar14;
  byte bVar15;
  int column_n;
  bool bVar16;
  ulong uVar17;
  int order_n;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int order_n_1;
  uint uVar21;
  ImGuiTableColumn *pIVar22;
  bool bVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int local_a8;
  float local_a4;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar7 = GImGui;
  uVar19 = table->Flags;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar26 = (pIVar7->Style).FramePadding.x;
  fVar25 = 1.0;
  if (1.0 <= fVar26) {
    fVar25 = fVar26;
  }
  table->MinColumnWidth = fVar25;
  uVar24 = 0xffffffff;
  fVar26 = 0.0;
  local_a4 = 0.0;
  bVar11 = false;
  bVar16 = false;
  local_a8 = 0;
  cVar10 = '\0';
  for (uVar18 = 0; (long)uVar18 < (long)table->ColumnsCount; uVar18 = uVar18 + 1) {
    bVar15 = (table->DisplayOrderToIndex).Data[uVar18];
    uVar21 = (uint)(char)bVar15;
    if (uVar18 != uVar21) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar22 = (table->Columns).Data + (char)bVar15;
    if (table->DeclColumnsCount <= (char)bVar15) {
      TableSetupColumnFlags(table,pIVar22,0);
      pIVar22->NameOffset = -1;
      pIVar22->UserID = 0;
      pIVar22->InitStretchWeightOrWidth = -1.0;
    }
    if (((table->Flags & 4) == 0) || ((pIVar22->Flags & 0x80) != 0)) {
      pIVar22->IsUserEnabledNextFrame = true;
      bVar8 = true;
    }
    else {
      bVar8 = pIVar22->IsUserEnabledNextFrame;
    }
    if (pIVar22->IsUserEnabled != (bool)bVar8) {
      pIVar22->IsUserEnabled = (bool)bVar8;
      table->IsSettingsDirty = true;
      bVar8 = pIVar22->IsUserEnabled;
    }
    bVar14 = (bool)((pIVar22->Flags & 1U) == 0 & bVar8);
    pIVar22->IsEnabled = bVar14;
    cVar9 = pIVar22->SortOrder;
    if ((cVar9 != -1) && (bVar14 == false)) {
      table->IsSortSpecsDirty = true;
      cVar9 = pIVar22->SortOrder;
    }
    if (('\0' < cVar9) && ((table->Flags & 0x4000000) == 0)) {
      table->IsSortSpecsDirty = true;
    }
    if ((&pIVar22->WidthRequest)[(ulong)((pIVar22->Flags & 0x10) == 0) * 2] <= 0.0 &&
        (&pIVar22->WidthRequest)[(ulong)((pIVar22->Flags & 0x10) == 0) * 2] != 0.0) {
      pIVar22->AutoFitQueue = '\a';
      pIVar22->CannotSkipItemsQueue = '\a';
    }
    if (pIVar22->IsEnabled == false) {
      pIVar22->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar22->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar24;
      pIVar22->NextEnabledColumn = -1;
      if (uVar24 == 0xffffffff) {
        table->LeftMostEnabledColumn = bVar15;
      }
      else {
        (table->Columns).Data[(int)uVar24].NextEnabledColumn = bVar15;
      }
      cVar9 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar9 + '\x01';
      pIVar22->IndexWithinEnabledSet = cVar9;
      table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar15 & 0x3f);
      table->EnabledMaskByDisplayOrder =
           table->EnabledMaskByDisplayOrder | 1L << (pIVar22->DisplayOrder & 0x3fU);
      if (pIVar22->IsPreserveWidthAuto == false) {
        fVar25 = TableGetColumnWidthAuto(table,pIVar22);
        pIVar22->WidthAuto = fVar25;
      }
      uVar3 = pIVar22->Flags;
      if ((uVar3 & 0x20) == 0) {
        bVar11 = true;
      }
      if ((((uVar3 & 0x10) != 0) && ((uVar3 & 0x20) != 0)) &&
         (0.0 < pIVar22->InitStretchWeightOrWidth)) {
        pIVar22->WidthAuto = pIVar22->InitStretchWeightOrWidth;
      }
      bVar16 = (bool)(bVar16 | pIVar22->AutoFitQueue != '\0');
      fVar25 = pIVar22->WidthAuto;
      uVar24 = uVar21;
      if ((uVar3 & 8) == 0) {
        fVar26 = (float)((uint)fVar26 & -(uint)(fVar25 <= fVar26) |
                        ~-(uint)(fVar25 <= fVar26) & (uint)fVar25);
        cVar10 = cVar10 + '\x01';
      }
      else {
        local_a4 = local_a4 + fVar25;
        local_a8 = local_a8 + 1;
      }
    }
  }
  if ((((table->Flags & 8U) != 0) && (((uint)table->Flags >> 0x1b & 1) == 0)) &&
     (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar24;
  if (bVar16) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  uVar19 = uVar19 & 0xe000;
  lVar12 = 99;
  fVar25 = 0.0;
  fVar27 = 0.0;
  for (uVar18 = 0; uVar17 = (ulong)table->ColumnsCount, (long)uVar18 < (long)uVar17;
      uVar18 = uVar18 + 1) {
    bVar15 = (byte)uVar18;
    if ((table->EnabledMaskByIndex >> (uVar18 & 0x3f) & 1) != 0) {
      pIVar22 = (table->Columns).Data;
      uVar24 = *(uint *)((long)pIVar22 + lVar12 + -99);
      if ((uVar24 & 0x10) == 0) {
        if ((((uVar24 & 0x20) != 0) || (*(char *)((long)&pIVar22->Flags + lVar12) != '\0')) ||
           (fVar28 = *(float *)((long)pIVar22 + lVar12 + -0x4b), fVar28 < 0.0)) {
          fVar28 = *(float *)((long)pIVar22 + lVar12 + -0x47);
          bVar16 = fVar28 <= 0.0;
          if (fVar28 <= 0.0) {
            fVar28 = 1.0;
          }
          if (bVar16 && uVar19 == 0x6000) {
            fVar28 = (*(float *)((long)pIVar22 + lVar12 + -0x4f) / local_a4) * (float)local_a8;
          }
          *(float *)((long)pIVar22 + lVar12 + -0x4b) = fVar28;
        }
        if (((long)table->LeftMostStretchedColumn == -1) ||
           (*(char *)((long)pIVar22 + lVar12 + -0x11) <
            (table->Columns).Data[table->LeftMostStretchedColumn].DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar15;
        }
        fVar25 = fVar25 + fVar28;
        if (((long)table->RightMostStretchedColumn == -1) ||
           ((table->Columns).Data[table->RightMostStretchedColumn].DisplayOrder <
            *(char *)((long)pIVar22 + lVar12 + -0x11))) {
          table->RightMostStretchedColumn = bVar15;
        }
      }
      else {
        cVar9 = *(char *)((long)&pIVar22->Flags + lVar12);
        if (uVar19 == 0x4000) {
          fVar28 = fVar26;
          if ((uVar24 & 0x20) != 0 || cVar9 != '\0') goto LAB_00203bee;
        }
        else {
          fVar28 = *(float *)((long)pIVar22 + lVar12 + -0x4f);
LAB_00203bee:
          if (cVar9 == '\0') {
            if (((uVar24 & 0x20) != 0) &&
               ((table->RequestOutputMaskByIndex & 1L << (bVar15 & 0x3f)) != 0)) {
              *(float *)((long)pIVar22 + lVar12 + -0x53) = fVar28;
            }
          }
          else {
            *(float *)((long)pIVar22 + lVar12 + -0x53) = fVar28;
            if (((cVar9 != '\x01') && (table->IsInitializing == true)) &&
               (*(char *)((long)pIVar22 + lVar12 + -2) == '\0')) {
              fVar28 = *(float *)((long)pIVar22 + lVar12 + -0x53);
              fVar29 = table->MinColumnWidth * 4.0;
              uVar24 = -(uint)(fVar29 <= fVar28);
              *(uint *)((long)pIVar22 + lVar12 + -0x53) =
                   ~uVar24 & (uint)fVar29 | (uint)fVar28 & uVar24;
            }
          }
        }
        fVar27 = fVar27 + *(float *)((long)pIVar22 + lVar12 + -0x53);
      }
      *(undefined1 *)((long)pIVar22 + lVar12 + -2) = 0;
      fVar27 = fVar27 + table->CellPaddingX + table->CellPaddingX;
    }
    lVar12 = lVar12 + 0x68;
  }
  table->ColumnsEnabledFixedCount = cVar10;
  table->ColumnsStretchSumWeights = fVar25;
  fVar26 = (table->WorkRect).Min.x;
  fVar28 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((table->Flags & 0x1000000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar29 = (table->WorkRect).Max.x - fVar26;
  }
  else {
    fVar29 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar2 = (table->WorkRect).Min.y;
  fVar27 = (fVar29 - fVar28) - fVar27;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar28
  ;
  lVar12 = 0;
  fVar28 = fVar27;
  for (uVar18 = 0; (long)uVar18 < (long)(int)uVar17; uVar18 = uVar18 + 1) {
    if ((table->EnabledMaskByIndex >> (uVar18 & 0x3f) & 1) != 0) {
      pIVar22 = (table->Columns).Data;
      uVar19 = *(uint *)((long)&pIVar22->Flags + lVar12);
      if ((uVar19 & 8) != 0) {
        fVar29 = (*(float *)((long)&pIVar22->StretchWeight + lVar12) / fVar25) * fVar27;
        uVar24 = -(uint)(table->MinColumnWidth <= fVar29);
        fVar29 = (float)(int)((float)(~uVar24 & (uint)table->MinColumnWidth | (uint)fVar29 & uVar24)
                             + 0.01);
        *(float *)((long)&pIVar22->WidthRequest + lVar12) = fVar29;
        fVar28 = fVar28 - fVar29;
      }
      if (((&pIVar22->NextEnabledColumn)[lVar12] == -1) && (table->LeftMostStretchedColumn != -1)) {
        *(uint *)((long)&pIVar22->Flags + lVar12) = uVar19 | 0x40000000;
      }
      fVar29 = *(float *)((long)&pIVar22->WidthRequest + lVar12);
      uVar19 = -(uint)(table->MinColumnWidth <= fVar29);
      fVar29 = (float)(int)(float)(~uVar19 & (uint)table->MinColumnWidth | (uint)fVar29 & uVar19);
      *(float *)((long)&pIVar22->WidthGiven + lVar12) = fVar29;
      table->ColumnsGivenWidth = fVar29 + table->ColumnsGivenWidth;
      uVar17 = (ulong)(uint)table->ColumnsCount;
    }
    lVar12 = lVar12 + 0x68;
  }
  if (((1.0 <= fVar28) && ((table->Flags & 0x80000) == 0)) && (0.0 < fVar25)) {
    uVar17 = uVar17 & 0xffffffff;
LAB_00203e66:
    uVar18 = uVar17 & 0xffffffff;
    do {
      uVar17 = uVar17 - 1;
      if ((fVar28 < 1.0) || ((int)uVar18 < 1)) break;
      if ((table->EnabledMaskByDisplayOrder >> (uVar17 & 0x3f) & 1) != 0) {
        pIVar22 = (table->Columns).Data;
        cVar10 = (table->DisplayOrderToIndex).Data[uVar17];
        if ((pIVar22[cVar10].Flags & 8) != 0) goto LAB_00203e9d;
      }
      uVar18 = (ulong)((int)uVar18 - 1);
    } while( true );
  }
  if ((long)table->InstanceCurrent == 0) {
    pIVar13 = &table->InstanceDataFirst;
  }
  else {
    pIVar13 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar25 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar27 = local_40.Min.y + pIVar13->LastOuterHeight;
  uVar19 = -(uint)(fVar27 <= fVar25);
  local_40.Max.y = (float)(uVar19 & (uint)fVar25 | ~uVar19 & (uint)fVar27);
  IVar4 = pIVar7->ActiveId;
  pIVar7->ActiveId = 0;
  iVar20 = 0;
  bVar14 = ItemHoverable(&local_40,0);
  pIVar7->ActiveId = IVar4;
  bVar16 = '\0' < table->FreezeColumnsCount;
  fVar25 = fVar26;
  if ('\0' < table->FreezeColumnsCount) {
    fVar25 = (table->OuterRect).Min.x;
  }
  fVar25 = (fVar25 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar18 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar18) {
      fVar26 = (table->WorkRect).Min.x;
      fVar25 = (table->Columns).Data[table->RightMostEnabledColumn].ClipRect.Max.x;
      uVar19 = -(uint)(fVar25 <= fVar26);
      fVar26 = (float)(uVar19 & (uint)fVar26 | ~uVar19 & (uint)fVar25);
      if (((bVar14) && (table->HoveredColumnBody == -1)) && (fVar26 <= (pIVar7->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      uVar19 = table->Flags;
      if (!bVar11 && (uVar19 & 1) != 0) {
        uVar19 = uVar19 & 0xfffffffe;
        table->Flags = uVar19;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar19 = uVar19 & 0xfffeffff;
        table->Flags = uVar19;
      }
      if ((uVar19 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar26;
        (table->OuterRect).Max.x = fVar26;
        fVar25 = (table->InnerClipRect).Max.x;
        if (fVar26 <= fVar25) {
          fVar25 = fVar26;
        }
        (table->InnerClipRect).Max.x = fVar25;
      }
      pIVar5 = table->InnerWindow;
      IVar6 = (table->WorkRect).Max;
      (pIVar5->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar5->ParentWorkRect).Max = IVar6;
      fVar26 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar26;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      pIVar13->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      bVar11 = TableBeginContextMenuPopup(table);
      if (bVar11) {
        TableDrawContextMenu(table);
        EndPopup();
      }
      uVar19 = table->Flags;
      if (((byte)((uVar19 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar19 = table->Flags;
      }
      pIVar5 = table->InnerWindow;
      if ((uVar19 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar5->DrawList,&(pIVar5->ClipRect).Min,&(pIVar5->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,2);
      }
      return;
    }
    bVar15 = (table->DisplayOrderToIndex).Data[uVar18];
    bVar23 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar23 = (char)bVar15 < table->FreezeColumnsCount;
    }
    pIVar22 = (table->Columns).Data + (char)bVar15;
    pIVar22->NavLayerCurrent = bVar23;
    if (bVar16) {
      bVar16 = true;
      if (iVar20 == table->FreezeColumnsCount) {
        fVar25 = fVar25 + (fVar26 - (table->OuterRect).Min.x);
        goto LAB_00203ff1;
      }
    }
    else {
LAB_00203ff1:
      bVar16 = false;
    }
    pbVar1 = (byte *)((long)&pIVar22->Flags + 3);
    *pbVar1 = *pbVar1 & 0xf0;
    if ((table->EnabledMaskByDisplayOrder >> (uVar18 & 0x3f) & 1) == 0) {
      (pIVar22->ClipRect).Max.x = fVar25;
      (pIVar22->ClipRect).Min.x = fVar25;
      pIVar22->WorkMinX = fVar25;
      pIVar22->MaxX = fVar25;
      pIVar22->MinX = fVar25;
      pIVar22->WidthGiven = 0.0;
      (pIVar22->ClipRect).Min.y = fVar2;
      (pIVar22->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar22->ClipRect,&host_clip_rect);
      pIVar22->IsVisibleX = false;
      pIVar22->IsVisibleY = false;
      pIVar22->IsRequestOutput = false;
      pIVar22->IsSkipItems = true;
      pIVar22->ItemWidth = 1.0;
    }
    else {
      if (((bVar14) && (fVar27 = (pIVar7->IO).MousePos.x, (pIVar22->ClipRect).Min.x <= fVar27)) &&
         (fVar27 < (pIVar22->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar15;
      }
      pIVar22->MinX = fVar25;
      fVar28 = TableGetMaxColumnWidth(table,(int)(char)bVar15);
      fVar27 = pIVar22->WidthGiven;
      if (fVar28 <= pIVar22->WidthGiven) {
        fVar27 = fVar28;
      }
      pIVar22->WidthGiven = fVar27;
      fVar28 = pIVar22->WidthRequest;
      if (table->MinColumnWidth <= pIVar22->WidthRequest) {
        fVar28 = table->MinColumnWidth;
      }
      fVar27 = (float)(~-(uint)(fVar28 <= fVar27) & (uint)fVar28 |
                      (uint)fVar27 & -(uint)(fVar28 <= fVar27));
      pIVar22->WidthGiven = fVar27;
      fVar28 = table->CellPaddingX + table->CellPaddingX +
               fVar27 + fVar25 + table->CellSpacingX1 + table->CellSpacingX2;
      pIVar22->MaxX = fVar28;
      pIVar22->WorkMinX = table->CellPaddingX + fVar25 + table->CellSpacingX1;
      pIVar22->WorkMaxX = (fVar28 - table->CellPaddingX) - table->CellSpacingX2;
      pIVar22->ItemWidth = (float)(int)(fVar27 * 0.65);
      (pIVar22->ClipRect).Min.x = fVar25;
      (pIVar22->ClipRect).Min.y = fVar2;
      (pIVar22->ClipRect).Max.x = fVar28;
      (pIVar22->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar22->ClipRect,&host_clip_rect);
      fVar27 = (pIVar22->ClipRect).Min.x;
      fVar28 = (pIVar22->ClipRect).Max.x;
      pIVar22->IsVisibleX = fVar27 < fVar28;
      pIVar22->IsVisibleY = true;
      if (fVar28 <= fVar27) {
        if (pIVar22->AutoFitQueue != '\0') goto LAB_002041a7;
        bVar23 = pIVar22->CannotSkipItemsQueue != '\0';
        pIVar22->IsRequestOutput = bVar23;
        if (bVar23) goto LAB_002041b1;
      }
      else {
        table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar15 & 0x3f);
LAB_002041a7:
        pIVar22->IsRequestOutput = true;
LAB_002041b1:
        table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar15 & 0x3f);
      }
      bVar23 = true;
      if (pIVar22->IsEnabled == true) {
        bVar23 = table->HostSkipItems;
      }
      pIVar22->IsSkipItems = bVar23;
      uVar19 = (uint)(fVar27 < fVar28) << 0x19 | pIVar22->Flags;
      uVar24 = uVar19 | 0x1000000;
      pIVar22->Flags = uVar24;
      if (pIVar22->SortOrder != -1) {
        uVar24 = uVar19 | 0x5000000;
        pIVar22->Flags = uVar24;
      }
      if (table->HoveredColumnBody == bVar15) {
        pIVar22->Flags = uVar24 | 0x8000000;
      }
      fVar27 = pIVar22->WorkMinX;
      pIVar22->ContentMaxXFrozen = fVar27;
      pIVar22->ContentMaxXUnfrozen = fVar27;
      pIVar22->ContentMaxXHeadersUsed = fVar27;
      pIVar22->ContentMaxXHeadersIdeal = fVar27;
      if (table->HostSkipItems == false) {
        pIVar22->AutoFitQueue = pIVar22->AutoFitQueue >> 1;
        pIVar22->CannotSkipItemsQueue = pIVar22->CannotSkipItemsQueue >> 1;
      }
      if (iVar20 < table->FreezeColumnsCount) {
        fVar28 = pIVar22->MaxX + 1.0;
        fVar27 = host_clip_rect.Max.x;
        if (fVar28 <= host_clip_rect.Max.x) {
          fVar27 = fVar28;
        }
        host_clip_rect.Min.x =
             (float)(-(uint)(fVar28 < host_clip_rect.Min.x) & (uint)host_clip_rect.Min.x |
                    ~-(uint)(fVar28 < host_clip_rect.Min.x) & (uint)fVar27);
      }
      fVar25 = fVar25 + table->CellPaddingX + table->CellPaddingX +
                        pIVar22->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      iVar20 = iVar20 + 1;
    }
    uVar18 = uVar18 + 1;
  } while( true );
LAB_00203e9d:
  pIVar22[cVar10].WidthRequest = pIVar22[cVar10].WidthRequest + 1.0;
  pIVar22[cVar10].WidthGiven = pIVar22[cVar10].WidthGiven + 1.0;
  fVar28 = fVar28 + -1.0;
  goto LAB_00203e66;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;
    table->ColumnsStretchSumWeights = stretch_sum_weights;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Determine if table is hovered which will be used to flag columns as hovered.
    // - In principle we'd like to use the equivalent of IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem),
    //   but because our item is partially submitted at this point we use ItemHoverable() and a workaround (temporarily
    //   clear ActiveId, which is equivalent to the change provided by _AllowWhenBLockedByActiveItem).
    // - This allows columns to be marked as hovered when e.g. clicking a button inside the column, or using drag and drop.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table_instance->LastOuterHeight));
    const ImGuiID backup_active_id = g.ActiveId;
    g.ActiveId = 0;
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);
    g.ActiveId = backup_active_id;

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table_instance->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (TableBeginContextMenuPopup(table))
    {
        TableDrawContextMenu(table);
        EndPopup();
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}